

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astWhileContinueWithNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  anon_struct_32_4_1fe0574e gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 4;
  local_20 = (undefined1 *)&local_78;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_78 = sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_78 + 0x18) = sVar2;
  *(sysbvm_tuple_t *)(local_78 + 0x20) = (context->roots).voidType;
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(local_78 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  if (*(sysbvm_tuple_t *)(local_78 + 0x28) != 0) {
    sStack_70 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                          (context,*(sysbvm_tuple_t *)(local_78 + 0x28),(context->roots).booleanType
                           ,arguments[1]);
    *(sysbvm_tuple_t *)(local_78 + 0x28) = sStack_70;
  }
  if (*(sysbvm_tuple_t *)(local_78 + 0x30) != 0) {
    local_68 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                         (context,*(sysbvm_tuple_t *)(local_78 + 0x30),(context->roots).voidType,
                          arguments[1]);
    *(sysbvm_tuple_t *)(local_78 + 0x30) = local_68;
  }
  if (*(sysbvm_tuple_t *)(local_78 + 0x38) != 0) {
    sStack_60 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                          (context,*(sysbvm_tuple_t *)(local_78 + 0x38),(context->roots).voidType,
                           arguments[1]);
    *(sysbvm_tuple_t *)(local_78 + 0x38) = sStack_60;
  }
  if (((*(sysbvm_tuple_t *)(local_78 + 0x28) != 0) &&
      (_Var1 = sysbvm_astNode_isLiteralNode(context,*(sysbvm_tuple_t *)(local_78 + 0x28)), _Var1))
     && (sVar2 = sysbvm_astLiteralNode_getValue(*(sysbvm_tuple_t *)(local_78 + 0x28)), sVar2 != 0x1f
        )) {
    sysbvm_stackFrame_popRecord(&local_50);
    sysbvm_stackFrame_popRecord(&local_38);
    sVar2 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(local_78 + 0x10),0x2f);
    return sVar2;
  }
  sysbvm_stackFrame_popRecord(&local_50);
  sysbvm_stackFrame_popRecord(&local_38);
  return local_78;
}

Assistant:

static sysbvm_tuple_t sysbvm_astWhileContinueWithNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astWhileContinueWithNode_t *whileNode;
        sysbvm_tuple_t analyzedConditionExpression;
        sysbvm_tuple_t analyzedBodyExpression;
        sysbvm_tuple_t analyzedContinueExpression;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.whileNode = (sysbvm_astWhileContinueWithNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.whileNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    gcFrame.whileNode->super.analyzedType = context->roots.voidType;

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.whileNode->super.sourcePosition);
    
    if(gcFrame.whileNode->conditionExpression)
    {
        gcFrame.analyzedConditionExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.whileNode->conditionExpression, context->roots.booleanType, *environment);
        gcFrame.whileNode->conditionExpression = gcFrame.analyzedConditionExpression;
    }

    if(gcFrame.whileNode->bodyExpression)
    {
        gcFrame.analyzedBodyExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.whileNode->bodyExpression, context->roots.voidType, *environment);
        gcFrame.whileNode->bodyExpression = gcFrame.analyzedBodyExpression;
    }

    if(gcFrame.whileNode->continueExpression)
    {
        gcFrame.analyzedContinueExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.whileNode->continueExpression, context->roots.voidType, *environment);
        gcFrame.whileNode->continueExpression = gcFrame.analyzedContinueExpression;
    }
    
    // Optimize out the loop if the condition is the literal false.
    if(gcFrame.whileNode->conditionExpression &&
        sysbvm_astNode_isLiteralNode(context, gcFrame.whileNode->conditionExpression) &&
        !sysbvm_tuple_boolean_decode(sysbvm_astLiteralNode_getValue(gcFrame.whileNode->conditionExpression)))
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_astLiteralNode_create(context, gcFrame.whileNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.whileNode;
}